

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::get_inner_entry_point_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this)

{
  CompilerError *this_00;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  undefined1 local_21;
  SPIREntryPoint *local_20;
  SPIREntryPoint *execution;
  CompilerHLSL *this_local;
  string *name;
  
  execution = (SPIREntryPoint *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  local_20 = Compiler::get_entry_point((Compiler *)this);
  if (((this->hlsl_options).use_entry_point_name & 1U) == 0) {
    if (local_20->model == ExecutionModelVertex) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"vert_main",local_35);
      ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    else if (local_20->model == ExecutionModelFragment) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"frag_main",&local_36);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    }
    else if (local_20->model == ExecutionModelGLCompute) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"comp_main",&local_37);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_37);
    }
    else if (local_20->model == ExecutionModelMeshEXT) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"mesh_main",&local_38);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_38);
    }
    else {
      if (local_20->model != ExecutionModelTaskEXT) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unsupported execution model.");
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"task_main",&local_39);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  else {
    local_21 = 0;
    join<std::__cxx11::string_const&,char_const(&)[7]>
              (__return_storage_ptr__,(spirv_cross *)&local_20->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_inner",
               (char (*) [7])local_20);
    ParsedIR::sanitize_underscores(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::get_inner_entry_point_name() const
{
	auto &execution = get_entry_point();

	if (hlsl_options.use_entry_point_name)
	{
		auto name = join(execution.name, "_inner");
		ParsedIR::sanitize_underscores(name);
		return name;
	}

	if (execution.model == ExecutionModelVertex)
		return "vert_main";
	else if (execution.model == ExecutionModelFragment)
		return "frag_main";
	else if (execution.model == ExecutionModelGLCompute)
		return "comp_main";
	else if (execution.model == ExecutionModelMeshEXT)
		return "mesh_main";
	else if (execution.model == ExecutionModelTaskEXT)
		return "task_main";
	else
		SPIRV_CROSS_THROW("Unsupported execution model.");
}